

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall argo::lexer::read_string(lexer *this)

{
  char c_00;
  json_parser_exception *pjVar1;
  size_t sVar2;
  size_t byte_index;
  token local_60;
  int local_20;
  bool local_19;
  int c;
  bool in_escape;
  size_t n;
  lexer *this_local;
  
  _c = 0;
  local_19 = false;
  n = (size_t)this;
  while( true ) {
    local_20 = (*this->m_reader->_vptr_reader[2])();
    if (local_20 < 0x10) {
      pjVar1 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      c_00 = (char)local_20;
      sVar2 = reader::get_byte_index(this->m_reader);
      json_parser_exception::json_parser_exception(pjVar1,invalid_character_e,c_00,sVar2);
      __cxa_throw(pjVar1,&json_parser_exception::typeinfo,
                  json_parser_exception::~json_parser_exception);
    }
    if ((local_20 == 0x22) && ((local_19 & 1U) == 0)) break;
    if (this->m_max_token_length <= _c) {
      pjVar1 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      sVar2 = this->m_max_token_length;
      byte_index = reader::get_byte_index(this->m_reader);
      json_parser_exception::json_parser_exception(pjVar1,string_too_long_e,sVar2,byte_index);
      __cxa_throw(pjVar1,&json_parser_exception::typeinfo,
                  json_parser_exception::~json_parser_exception);
    }
    this->m_buffer[_c] = (char)local_20;
    local_19 = local_20 == 0x5c;
    _c = _c + 1;
  }
  token::token(&local_60,string_e,this->m_buffer,_c);
  token::operator=(&this->m_token,&local_60);
  token::~token(&local_60);
  return;
}

Assistant:

void lexer::read_string()
{
    size_t n = 0;
    bool in_escape = false;

    while (true)
    {
        int c;

        c = m_reader.next();
        if (c <= 0xf)
        {
            throw json_parser_exception(
                        json_parser_exception::invalid_character_e,
                        static_cast<char>(c),
                        m_reader.get_byte_index());
        }
        else if (c == '"' && !in_escape)
        {
            m_token = token(token::string_e, m_buffer, n);
            return;
        }
        else
        {
            if (n >= m_max_token_length)
            {
                throw json_parser_exception(
                            json_parser_exception::string_too_long_e,
                            m_max_token_length,
                            m_reader.get_byte_index());
            }
            else
            {
                m_buffer[n++] = c;
            }
        }
        in_escape = (c == '\\');
    }
}